

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

QSslCertificate __thiscall QSslSocket::localCertificate(QSslSocket *this)

{
  long in_RSI;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*(long *)(in_RSI + 8) + 0x2d0) == 0) {
    local_38.d.d = (Data *)0x0;
    local_38.d.ptr = (char *)0x0;
    local_38.d.size = 0;
    QSslCertificate::QSslCertificate((QSslCertificate *)this,&local_38,Pem);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_0024cfff;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_0024cfff:
      __stack_chk_fail();
    }
    QSslCertificate::QSslCertificate
              ((QSslCertificate *)this,*(QSslCertificate **)(*(long *)(in_RSI + 8) + 0x2c8));
  }
  return (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
         (QExplicitlySharedDataPointer<QSslCertificatePrivate>)this;
}

Assistant:

QSslCertificate QSslSocket::localCertificate() const
{
    Q_D(const QSslSocket);
    if (d->configuration.localCertificateChain.isEmpty())
        return QSslCertificate();
    return d->configuration.localCertificateChain[0];
}